

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void do_gop(void *x,int n,char *op,int type,ARMCI_Group group)

{
  char cVar1;
  void *__dest;
  undefined4 uVar2;
  int iVar3;
  void *pvVar4;
  undefined4 in_register_0000000c;
  char *op_00;
  int n_00;
  long lVar5;
  undefined *puVar6;
  ARMCI_Group AVar7;
  ARMCI_Group group_00;
  MPI_Comm poVar8;
  int mpi_type_size;
  ARMCI_Group AStack_84;
  int local_4c;
  undefined4 local_48;
  int local_44;
  void *local_40;
  undefined *local_38;
  
  op_00 = (char *)CONCAT44(in_register_0000000c,type);
  local_4c = 0;
  AVar7 = group;
  local_44 = n;
  local_40 = x;
  if (group == -2) {
    poVar8 = (MPI_Comm)&ompi_mpi_comm_self;
  }
  else {
    poVar8 = get_comm((ARMCI_Group *)(ulong)(uint)group);
  }
  if (type < -0x66) {
    if (type == -0x133) {
      puVar6 = &ompi_mpi_double;
    }
    else {
      if (type != -0x132) {
LAB_001739e3:
        iVar3 = 0x1c85ea;
        pvVar4 = (void *)(ulong)(uint)type;
        comex_error("armci_type_to_mpi_type: unrecognized type",type);
        if (iVar3 != 0x151) {
          ARMCI_Group_get_default(&AStack_84);
          do_gop(pvVar4,n_00,op_00,AVar7,AStack_84);
          return;
        }
        group_00 = ARMCI_Node_group;
        if (_number_of_procs_per_node < 2) {
          group_00 = -2;
        }
        do_gop(pvVar4,n_00,op_00,AVar7,group_00);
        return;
      }
      puVar6 = &ompi_mpi_float;
    }
  }
  else if (type == -0x66) {
    puVar6 = &ompi_mpi_long_long_int;
  }
  else if (type == -99) {
    puVar6 = &ompi_mpi_int;
  }
  else {
    if (type != -0x65) goto LAB_001739e3;
    puVar6 = &ompi_mpi_long;
  }
  MPI_Type_size(puVar6,&local_4c);
  cVar1 = *op;
  local_38 = puVar6;
  if (cVar1 == '*') {
    puVar6 = &ompi_mpi_op_prod;
    goto LAB_001738eb;
  }
  if (cVar1 == '+') {
    puVar6 = &ompi_mpi_op_sum;
    goto LAB_001738eb;
  }
  if (cVar1 == 'm') {
    if (op[1] != 'i') {
      if ((op[1] != 'a') || (op[2] != 'x')) goto LAB_0017377c;
LAB_001737df:
      puVar6 = &ompi_mpi_op_max;
      goto LAB_001738eb;
    }
    if (op[2] != 'n') goto LAB_0017377c;
  }
  else {
LAB_0017377c:
    iVar3 = strncmp(op,"absmin",6);
    if (iVar3 != 0) {
      iVar3 = strncmp(op,"absmax",6);
      if (iVar3 == 0) goto LAB_001737df;
      if (cVar1 == '&') {
        if ((op[1] != '&') && (iVar3 = strncmp(op,"land",4), iVar3 != 0)) {
          puVar6 = &ompi_mpi_op_band;
          goto LAB_001738eb;
        }
LAB_00173864:
        puVar6 = &ompi_mpi_op_land;
        goto LAB_001738eb;
      }
      if (cVar1 == 'o') {
        if (op[1] != 'r') {
          iVar3 = strncmp(op,"land",4);
          if (iVar3 != 0) goto LAB_00173887;
          goto LAB_00173864;
        }
      }
      else {
        iVar3 = strncmp(op,"land",4);
        if (iVar3 == 0) goto LAB_00173864;
        if (cVar1 == 'l') {
          if ((op[1] == 'o') && (op[2] == 'r')) {
LAB_0017387b:
            puVar6 = &ompi_mpi_op_lor;
            goto LAB_001738eb;
          }
LAB_00173887:
          uVar2 = 0;
        }
        else {
          if (cVar1 != '|') goto LAB_00173887;
          uVar2 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
          if (op[1] == '|') goto LAB_0017387b;
        }
        local_48 = uVar2;
        iVar3 = strncmp(op,"band",4);
        if (iVar3 != 0) {
          puVar6 = &ompi_mpi_op_bor;
        }
        else {
          puVar6 = &ompi_mpi_op_band;
        }
        if ((char)local_48 != '\0' || iVar3 == 0) goto LAB_001738eb;
        if (((cVar1 != 'b') || (op[1] != 'o')) || (op[2] != 'r')) {
          comex_error("Unsupported gop operation",1);
          goto LAB_001738eb;
        }
      }
      puVar6 = &ompi_mpi_op_bor;
      goto LAB_001738eb;
    }
  }
  puVar6 = &ompi_mpi_op_min;
LAB_001738eb:
  iVar3 = strncmp(op,"absmin",6);
  if ((iVar3 == 0) || (iVar3 = strncmp(op,"absmax",6), iVar3 == 0)) {
    do_abs(local_40,local_44,type);
  }
  iVar3 = local_44;
  lVar5 = (long)local_44;
  pvVar4 = malloc(local_4c * lVar5);
  if (pvVar4 == (void *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0xd7,"void do_gop(void *, int, char *, int, ARMCI_Group)");
  }
  if (group != -2) {
    comex_barrier(group);
  }
  __dest = local_40;
  iVar3 = MPI_Allreduce(local_40,pvVar4,iVar3,local_38,puVar6,poVar8);
  if (iVar3 != 0) {
    __assert_fail("rc == MPI_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0xdd,"void do_gop(void *, int, char *, int, ARMCI_Group)");
  }
  memcpy(__dest,pvVar4,local_4c * lVar5);
  free(pvVar4);
  return;
}

Assistant:

static void do_gop(void *x, int n, char* op, int type, ARMCI_Group group)
{
    MPI_Comm comm = MPI_COMM_NULL;
    int mpi_type_size = 0;
    MPI_Datatype mpi_type = MPI_DATATYPE_NULL;
    int rc = 0;
    void *result = NULL;
    MPI_Op mpi_op = MPI_OP_NULL;

    if (ARMCI_GROUP_SELF == group) {
        comm = MPI_COMM_SELF;
    }
    else {
        comm = get_comm(&group);
    }
    mpi_type = armci_type_to_mpi_type(type);
    MPI_Type_size(mpi_type, &mpi_type_size);
    mpi_op = armci_op_to_mpi_op(op);

    if (strncmp(op, "absmin", 6) == 0) {
        do_abs(x, n, type);
    }
    else if (strncmp(op, "absmax", 6) == 0) {
        do_abs(x, n, type);
    }
        
    result = malloc(n*mpi_type_size);
    assert(result);

    if (ARMCI_GROUP_SELF != group) {
        comex_barrier(group);
    }
    rc = MPI_Allreduce(x, result, n, mpi_type, mpi_op, comm); 
    assert(rc == MPI_SUCCESS);

    memcpy(x, result, mpi_type_size * n);
    free(result);
}